

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

void output_in_edges(gen_ctx_t gen_ctx,bb_t_conflict bb)

{
  in_edge_t_conflict peVar1;
  char *pcVar2;
  char *pcVar3;
  
  fwrite("  in edges:",0xb,1,(FILE *)gen_ctx->debug_file);
  for (peVar1 = (bb->in_edges).head; peVar1 != (in_edge_t_conflict)0x0;
      peVar1 = (peVar1->in_link).next) {
    pcVar2 = "f";
    pcVar3 = "*";
    if (peVar1->fall_through_p == '\0') {
      pcVar2 = "";
    }
    if (peVar1->back_edge_p == '\0') {
      pcVar3 = "";
    }
    fprintf((FILE *)gen_ctx->debug_file," %3lu%s%s",peVar1->src->index,pcVar2,pcVar3);
  }
  fputc(10,(FILE *)gen_ctx->debug_file);
  return;
}

Assistant:

static void output_in_edges (gen_ctx_t gen_ctx, bb_t bb) {
  edge_t e;

  fprintf (debug_file, "  in edges:");
  for (e = DLIST_HEAD (in_edge_t, bb->in_edges); e != NULL; e = DLIST_NEXT (in_edge_t, e)) {
    fprintf (debug_file, " %3lu%s%s", (unsigned long) e->src->index, e->fall_through_p ? "f" : "",
             e->back_edge_p ? "*" : "");
  }
  fprintf (debug_file, "\n");
}